

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util_tests.cpp
# Opt level: O0

void __thiscall util_tests::util_ParseByteUnits::test_method(util_ParseByteUnits *this)

{
  string_view str;
  string_view str_00;
  string_view str_01;
  string_view str_02;
  string_view str_03;
  string_view str_04;
  string_view str_05;
  string_view str_06;
  string_view str_07;
  string_view str_08;
  string_view str_09;
  string_view str_10;
  string_view str_11;
  string_view str_12;
  string_view str_13;
  string_view str_14;
  string_view str_15;
  string_view str_16;
  string_view str_17;
  string_view str_18;
  string_view str_19;
  bool bVar1;
  unsigned_long *puVar2;
  long in_FS_OFFSET;
  optional<unsigned_long> oVar3;
  ByteUnit noop;
  char *in_stack_fffffffffffff088;
  lazy_ostream *in_stack_fffffffffffff090;
  char *in_stack_fffffffffffff098;
  char *in_stack_fffffffffffff0a0;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffff0a8;
  const_string *in_stack_fffffffffffff0b0;
  const_string *msg;
  size_t in_stack_fffffffffffff0b8;
  undefined1 *line_num;
  const_string *in_stack_fffffffffffff0c0;
  const_string *file;
  lazy_ostream *in_stack_fffffffffffff0c8;
  ByteUnit in_stack_fffffffffffff0d0;
  const_string *default_multiplier;
  size_t in_stack_fffffffffffff100;
  undefined1 *puVar4;
  lazy_ostream *in_stack_fffffffffffff108;
  const_string local_b00 [2];
  lazy_ostream local_ae0 [3];
  assertion_result local_ab0;
  const_string local_a98;
  undefined1 local_a88 [16];
  const_string local_a78 [2];
  lazy_ostream local_a58 [3];
  assertion_result local_a28 [2];
  const_string local_9f0 [2];
  lazy_ostream local_9d0 [3];
  assertion_result local_9a0;
  undefined1 local_988 [32];
  lazy_ostream local_968;
  undefined1 local_950 [16];
  undefined1 local_940 [64];
  const_string local_900 [2];
  lazy_ostream local_8e0 [3];
  assertion_result local_8b0 [2];
  const_string local_878 [2];
  lazy_ostream local_858 [3];
  assertion_result local_828 [2];
  const_string local_7f0 [2];
  lazy_ostream local_7d0 [3];
  assertion_result local_7a0 [2];
  const_string local_768 [2];
  lazy_ostream local_748 [3];
  assertion_result local_718 [2];
  const_string local_6e0 [2];
  lazy_ostream local_6c0 [3];
  assertion_result local_690 [2];
  const_string local_658 [2];
  lazy_ostream local_638 [3];
  assertion_result local_608 [2];
  lazy_ostream local_5d0;
  undefined1 local_5b8 [16];
  undefined1 local_5a8 [64];
  lazy_ostream local_568;
  undefined1 local_550 [16];
  undefined1 local_540 [64];
  lazy_ostream local_500;
  undefined1 local_4e8 [16];
  undefined1 local_4d8 [64];
  lazy_ostream local_498;
  undefined1 local_480 [16];
  undefined1 local_470 [64];
  lazy_ostream local_430;
  undefined1 local_418 [16];
  undefined1 local_408 [64];
  lazy_ostream local_3c8;
  undefined1 local_3b0 [16];
  undefined1 local_3a0 [64];
  lazy_ostream local_360;
  undefined1 local_348 [16];
  undefined1 local_338 [64];
  lazy_ostream local_2f8;
  undefined1 local_2e0 [16];
  undefined1 local_2d0 [64];
  lazy_ostream local_290;
  undefined1 local_278 [16];
  undefined1 local_268 [68];
  lazy_ostream local_224;
  undefined1 local_210 [16];
  undefined1 local_200 [68];
  lazy_ostream local_1bc;
  undefined1 local_1a8 [16];
  undefined1 local_198 [64];
  _Storage<unsigned_long,_true> local_158;
  undefined1 local_150;
  _Storage<unsigned_long,_true> local_148;
  undefined1 local_140;
  _Storage<unsigned_long,_true> local_138;
  undefined1 local_130;
  _Storage<unsigned_long,_true> local_128;
  undefined1 local_120;
  _Storage<unsigned_long,_true> local_118;
  undefined1 local_110;
  _Storage<unsigned_long,_true> local_108;
  undefined1 local_100;
  _Storage<unsigned_long,_true> local_f8;
  undefined1 local_f0;
  _Storage<unsigned_long,_true> local_e8;
  undefined1 local_e0;
  _Storage<unsigned_long,_true> local_d8;
  undefined1 local_d0;
  _Storage<unsigned_long,_true> local_c8;
  undefined1 local_c0;
  _Storage<unsigned_long,_true> local_b8;
  undefined1 local_b0;
  _Storage<unsigned_long,_true> local_a8;
  undefined1 local_a0;
  _Storage<unsigned_long,_true> local_98;
  undefined1 local_90;
  _Storage<unsigned_long,_true> local_88;
  undefined1 local_80;
  _Storage<unsigned_long,_true> local_78;
  undefined1 local_70;
  _Storage<unsigned_long,_true> local_68;
  undefined1 local_60;
  _Storage<unsigned_long,_true> local_58;
  undefined1 local_50;
  _Storage<unsigned_long,_true> local_48;
  undefined1 local_40;
  _Storage<unsigned_long,_true> local_38;
  undefined1 local_30;
  _Storage<unsigned_long,_true> local_28;
  undefined1 local_20;
  _Storage<unsigned_long,_true> local_18;
  undefined1 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff098,
               (pointer)in_stack_fffffffffffff090,(unsigned_long)in_stack_fffffffffffff088);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff088);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff0c8,in_stack_fffffffffffff0c0,
               in_stack_fffffffffffff0b8,in_stack_fffffffffffff0b0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffff090,(char (*) [1])in_stack_fffffffffffff088);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff098,
               (pointer)in_stack_fffffffffffff090,(unsigned_long)in_stack_fffffffffffff088);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffff0a8,in_stack_fffffffffffff0a0);
    str._M_str = (char *)in_stack_fffffffffffff108;
    str._M_len = in_stack_fffffffffffff100;
    oVar3 = ParseByteUnits(str,in_stack_fffffffffffff0d0);
    local_18._M_value =
         oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long>._M_payload;
    local_10 = oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
               super__Optional_payload_base<unsigned_long>._M_engaged;
    puVar2 = std::optional<unsigned_long>::value
                       ((optional<unsigned_long> *)in_stack_fffffffffffff098);
    local_1bc._vptr_lazy_ostream._0_4_ = 1;
    in_stack_fffffffffffff098 = "1";
    in_stack_fffffffffffff090 = &local_1bc;
    in_stack_fffffffffffff088 = "ParseByteUnits(\"1\", noop).value()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,int>
              (local_198,local_1a8,0x6ba,1,2,puVar2);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff088);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff098,
               (pointer)in_stack_fffffffffffff090,(unsigned_long)in_stack_fffffffffffff088);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff088);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff0c8,in_stack_fffffffffffff0c0,
               in_stack_fffffffffffff0b8,in_stack_fffffffffffff0b0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffff090,(char (*) [1])in_stack_fffffffffffff088);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff098,
               (pointer)in_stack_fffffffffffff090,(unsigned_long)in_stack_fffffffffffff088);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffff0a8,in_stack_fffffffffffff0a0);
    str_00._M_str = (char *)in_stack_fffffffffffff108;
    str_00._M_len = in_stack_fffffffffffff100;
    oVar3 = ParseByteUnits(str_00,in_stack_fffffffffffff0d0);
    local_28._M_value =
         oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long>._M_payload;
    local_20 = oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
               super__Optional_payload_base<unsigned_long>._M_engaged;
    puVar2 = std::optional<unsigned_long>::value
                       ((optional<unsigned_long> *)in_stack_fffffffffffff098);
    local_224._vptr_lazy_ostream._0_4_ = 0;
    in_stack_fffffffffffff098 = "0";
    in_stack_fffffffffffff090 = &local_224;
    in_stack_fffffffffffff088 = "ParseByteUnits(\"0\", noop).value()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,int>
              (local_200,local_210,0x6bb,1,2,puVar2);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff088);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff098,
               (pointer)in_stack_fffffffffffff090,(unsigned_long)in_stack_fffffffffffff088);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff088);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff0c8,in_stack_fffffffffffff0c0,
               in_stack_fffffffffffff0b8,in_stack_fffffffffffff0b0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffff090,(char (*) [1])in_stack_fffffffffffff088);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff098,
               (pointer)in_stack_fffffffffffff090,(unsigned_long)in_stack_fffffffffffff088);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffff0a8,in_stack_fffffffffffff0a0);
    str_01._M_str = (char *)in_stack_fffffffffffff108;
    str_01._M_len = in_stack_fffffffffffff100;
    oVar3 = ParseByteUnits(str_01,in_stack_fffffffffffff0d0);
    local_38._M_value =
         oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long>._M_payload;
    local_30 = oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
               super__Optional_payload_base<unsigned_long>._M_engaged;
    puVar2 = std::optional<unsigned_long>::value
                       ((optional<unsigned_long> *)in_stack_fffffffffffff098);
    local_290._vptr_lazy_ostream = (_func_int **)0x3e8;
    in_stack_fffffffffffff098 = "1000ULL";
    in_stack_fffffffffffff090 = &local_290;
    in_stack_fffffffffffff088 = "ParseByteUnits(\"1k\", noop).value()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long_long>
              (local_268,local_278,0x6bd,1,2,puVar2);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff088);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff098,
               (pointer)in_stack_fffffffffffff090,(unsigned_long)in_stack_fffffffffffff088);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff088);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff0c8,in_stack_fffffffffffff0c0,
               in_stack_fffffffffffff0b8,in_stack_fffffffffffff0b0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffff090,(char (*) [1])in_stack_fffffffffffff088);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff098,
               (pointer)in_stack_fffffffffffff090,(unsigned_long)in_stack_fffffffffffff088);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffff0a8,in_stack_fffffffffffff0a0);
    str_02._M_str = (char *)in_stack_fffffffffffff108;
    str_02._M_len = in_stack_fffffffffffff100;
    oVar3 = ParseByteUnits(str_02,in_stack_fffffffffffff0d0);
    local_48._M_value =
         oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long>._M_payload;
    local_40 = oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
               super__Optional_payload_base<unsigned_long>._M_engaged;
    puVar2 = std::optional<unsigned_long>::value
                       ((optional<unsigned_long> *)in_stack_fffffffffffff098);
    local_2f8._vptr_lazy_ostream = (_func_int **)0x400;
    in_stack_fffffffffffff098 = "1ULL << 10";
    in_stack_fffffffffffff090 = &local_2f8;
    in_stack_fffffffffffff088 = "ParseByteUnits(\"1K\", noop).value()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long_long>
              (local_2d0,local_2e0,0x6be,1,2,puVar2);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff088);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff098,
               (pointer)in_stack_fffffffffffff090,(unsigned_long)in_stack_fffffffffffff088);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff088);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff0c8,in_stack_fffffffffffff0c0,
               in_stack_fffffffffffff0b8,in_stack_fffffffffffff0b0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffff090,(char (*) [1])in_stack_fffffffffffff088);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff098,
               (pointer)in_stack_fffffffffffff090,(unsigned_long)in_stack_fffffffffffff088);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffff0a8,in_stack_fffffffffffff0a0);
    str_03._M_str = (char *)in_stack_fffffffffffff108;
    str_03._M_len = in_stack_fffffffffffff100;
    oVar3 = ParseByteUnits(str_03,in_stack_fffffffffffff0d0);
    local_58._M_value =
         oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long>._M_payload;
    local_50 = oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
               super__Optional_payload_base<unsigned_long>._M_engaged;
    puVar2 = std::optional<unsigned_long>::value
                       ((optional<unsigned_long> *)in_stack_fffffffffffff098);
    local_360._vptr_lazy_ostream = (_func_int **)0x1e8480;
    in_stack_fffffffffffff098 = "2\'000\'000ULL";
    in_stack_fffffffffffff090 = &local_360;
    in_stack_fffffffffffff088 = "ParseByteUnits(\"2m\", noop).value()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long_long>
              (local_338,local_348,0x6c0,1,2,puVar2);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff088);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff098,
               (pointer)in_stack_fffffffffffff090,(unsigned_long)in_stack_fffffffffffff088);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff088);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff0c8,in_stack_fffffffffffff0c0,
               in_stack_fffffffffffff0b8,in_stack_fffffffffffff0b0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffff090,(char (*) [1])in_stack_fffffffffffff088);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff098,
               (pointer)in_stack_fffffffffffff090,(unsigned_long)in_stack_fffffffffffff088);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffff0a8,in_stack_fffffffffffff0a0);
    str_04._M_str = (char *)in_stack_fffffffffffff108;
    str_04._M_len = in_stack_fffffffffffff100;
    oVar3 = ParseByteUnits(str_04,in_stack_fffffffffffff0d0);
    local_68._M_value =
         oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long>._M_payload;
    local_60 = oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
               super__Optional_payload_base<unsigned_long>._M_engaged;
    puVar2 = std::optional<unsigned_long>::value
                       ((optional<unsigned_long> *)in_stack_fffffffffffff098);
    local_3c8._vptr_lazy_ostream = (_func_int **)0x200000;
    in_stack_fffffffffffff098 = "2ULL << 20";
    in_stack_fffffffffffff090 = &local_3c8;
    in_stack_fffffffffffff088 = "ParseByteUnits(\"2M\", noop).value()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long_long>
              (local_3a0,local_3b0,0x6c1,1,2,puVar2);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff088);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff098,
               (pointer)in_stack_fffffffffffff090,(unsigned_long)in_stack_fffffffffffff088);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff088);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff0c8,in_stack_fffffffffffff0c0,
               in_stack_fffffffffffff0b8,in_stack_fffffffffffff0b0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffff090,(char (*) [1])in_stack_fffffffffffff088);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff098,
               (pointer)in_stack_fffffffffffff090,(unsigned_long)in_stack_fffffffffffff088);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffff0a8,in_stack_fffffffffffff0a0);
    str_05._M_str = (char *)in_stack_fffffffffffff108;
    str_05._M_len = in_stack_fffffffffffff100;
    oVar3 = ParseByteUnits(str_05,in_stack_fffffffffffff0d0);
    local_78._M_value =
         oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long>._M_payload;
    local_70 = oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
               super__Optional_payload_base<unsigned_long>._M_engaged;
    puVar2 = std::optional<unsigned_long>::value
                       ((optional<unsigned_long> *)in_stack_fffffffffffff098);
    local_430._vptr_lazy_ostream = (_func_int **)0xb2d05e00;
    in_stack_fffffffffffff098 = "3\'000\'000\'000ULL";
    in_stack_fffffffffffff090 = &local_430;
    in_stack_fffffffffffff088 = "ParseByteUnits(\"3g\", noop).value()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long_long>
              (local_408,local_418,0x6c3,1,2,puVar2);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff088);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff098,
               (pointer)in_stack_fffffffffffff090,(unsigned_long)in_stack_fffffffffffff088);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff088);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff0c8,in_stack_fffffffffffff0c0,
               in_stack_fffffffffffff0b8,in_stack_fffffffffffff0b0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffff090,(char (*) [1])in_stack_fffffffffffff088);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff098,
               (pointer)in_stack_fffffffffffff090,(unsigned_long)in_stack_fffffffffffff088);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffff0a8,in_stack_fffffffffffff0a0);
    str_06._M_str = (char *)in_stack_fffffffffffff108;
    str_06._M_len = in_stack_fffffffffffff100;
    oVar3 = ParseByteUnits(str_06,in_stack_fffffffffffff0d0);
    local_88._M_value =
         oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long>._M_payload;
    local_80 = oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
               super__Optional_payload_base<unsigned_long>._M_engaged;
    puVar2 = std::optional<unsigned_long>::value
                       ((optional<unsigned_long> *)in_stack_fffffffffffff098);
    local_498._vptr_lazy_ostream = (_func_int **)0xc0000000;
    in_stack_fffffffffffff098 = "3ULL << 30";
    in_stack_fffffffffffff090 = &local_498;
    in_stack_fffffffffffff088 = "ParseByteUnits(\"3G\", noop).value()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long_long>
              (local_470,local_480,0x6c4,1,2,puVar2);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff088);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff098,
               (pointer)in_stack_fffffffffffff090,(unsigned_long)in_stack_fffffffffffff088);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff088);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff0c8,in_stack_fffffffffffff0c0,
               in_stack_fffffffffffff0b8,in_stack_fffffffffffff0b0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffff090,(char (*) [1])in_stack_fffffffffffff088);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff098,
               (pointer)in_stack_fffffffffffff090,(unsigned_long)in_stack_fffffffffffff088);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffff0a8,in_stack_fffffffffffff0a0);
    str_07._M_str = (char *)in_stack_fffffffffffff108;
    str_07._M_len = in_stack_fffffffffffff100;
    oVar3 = ParseByteUnits(str_07,in_stack_fffffffffffff0d0);
    local_98._M_value =
         oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long>._M_payload;
    local_90 = oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
               super__Optional_payload_base<unsigned_long>._M_engaged;
    puVar2 = std::optional<unsigned_long>::value
                       ((optional<unsigned_long> *)in_stack_fffffffffffff098);
    local_500._vptr_lazy_ostream = (_func_int **)0x3a352944000;
    in_stack_fffffffffffff098 = "4\'000\'000\'000\'000ULL";
    in_stack_fffffffffffff090 = &local_500;
    in_stack_fffffffffffff088 = "ParseByteUnits(\"4t\", noop).value()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long_long>
              (local_4d8,local_4e8,0x6c6,1,2,puVar2);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff088);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff098,
               (pointer)in_stack_fffffffffffff090,(unsigned_long)in_stack_fffffffffffff088);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff088);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff0c8,in_stack_fffffffffffff0c0,
               in_stack_fffffffffffff0b8,in_stack_fffffffffffff0b0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffff090,(char (*) [1])in_stack_fffffffffffff088);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff098,
               (pointer)in_stack_fffffffffffff090,(unsigned_long)in_stack_fffffffffffff088);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffff0a8,in_stack_fffffffffffff0a0);
    str_08._M_str = (char *)in_stack_fffffffffffff108;
    str_08._M_len = in_stack_fffffffffffff100;
    oVar3 = ParseByteUnits(str_08,in_stack_fffffffffffff0d0);
    local_a8._M_value =
         oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long>._M_payload;
    local_a0 = oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
               super__Optional_payload_base<unsigned_long>._M_engaged;
    puVar2 = std::optional<unsigned_long>::value
                       ((optional<unsigned_long> *)in_stack_fffffffffffff098);
    local_568._vptr_lazy_ostream = (_func_int **)0x40000000000;
    in_stack_fffffffffffff098 = "4ULL << 40";
    in_stack_fffffffffffff090 = &local_568;
    in_stack_fffffffffffff088 = "ParseByteUnits(\"4T\", noop).value()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long_long>
              (local_540,local_550,0x6c7,1,2,puVar2);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff088);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff098,
               (pointer)in_stack_fffffffffffff090,(unsigned_long)in_stack_fffffffffffff088);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff088);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff0c8,in_stack_fffffffffffff0c0,
               in_stack_fffffffffffff0b8,in_stack_fffffffffffff0b0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffff090,(char (*) [1])in_stack_fffffffffffff088);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff098,
               (pointer)in_stack_fffffffffffff090,(unsigned_long)in_stack_fffffffffffff088);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffff0a8,in_stack_fffffffffffff0a0);
    str_09._M_str = (char *)in_stack_fffffffffffff108;
    str_09._M_len = in_stack_fffffffffffff100;
    oVar3 = ParseByteUnits(str_09,in_stack_fffffffffffff0d0);
    local_b8._M_value =
         oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long>._M_payload;
    local_b0 = oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
               super__Optional_payload_base<unsigned_long>._M_engaged;
    puVar2 = std::optional<unsigned_long>::value
                       ((optional<unsigned_long> *)in_stack_fffffffffffff098);
    local_5d0._vptr_lazy_ostream = (_func_int **)0x1400;
    in_stack_fffffffffffff098 = "5ULL << 10";
    in_stack_fffffffffffff090 = &local_5d0;
    in_stack_fffffffffffff088 = "ParseByteUnits(\"5\", ByteUnit::K).value()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long_long>
              (local_5a8,local_5b8,0x6ca,1,2,puVar2);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff088);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff098,
               (pointer)in_stack_fffffffffffff090,(unsigned_long)in_stack_fffffffffffff088);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff088);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff0c8,in_stack_fffffffffffff0c0,
               in_stack_fffffffffffff0b8,in_stack_fffffffffffff0b0);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffff0a8,in_stack_fffffffffffff0a0);
    str_10._M_str = (char *)in_stack_fffffffffffff108;
    str_10._M_len = in_stack_fffffffffffff100;
    oVar3 = ParseByteUnits(str_10,in_stack_fffffffffffff0d0);
    local_c8._M_value =
         oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long>._M_payload;
    local_c0 = oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
               super__Optional_payload_base<unsigned_long>._M_engaged;
    std::optional::operator_cast_to_bool((optional<unsigned_long> *)in_stack_fffffffffffff088);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff098,
               SUB81((ulong)in_stack_fffffffffffff090 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff098,
               (pointer)in_stack_fffffffffffff090,(unsigned_long)in_stack_fffffffffffff088);
    boost::unit_test::operator<<
              (in_stack_fffffffffffff090,(basic_cstring<const_char> *)in_stack_fffffffffffff088);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff098,
               (pointer)in_stack_fffffffffffff090,(unsigned_long)in_stack_fffffffffffff088);
    in_stack_fffffffffffff088 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_608,local_638,local_658,0x6cd,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff088);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff088);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff098,
               (pointer)in_stack_fffffffffffff090,(unsigned_long)in_stack_fffffffffffff088);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff088);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff0c8,in_stack_fffffffffffff0c0,
               in_stack_fffffffffffff0b8,in_stack_fffffffffffff0b0);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffff0a8,in_stack_fffffffffffff0a0);
    str_11._M_str = (char *)in_stack_fffffffffffff108;
    str_11._M_len = in_stack_fffffffffffff100;
    oVar3 = ParseByteUnits(str_11,in_stack_fffffffffffff0d0);
    local_d8._M_value =
         oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long>._M_payload;
    local_d0 = oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
               super__Optional_payload_base<unsigned_long>._M_engaged;
    std::optional::operator_cast_to_bool((optional<unsigned_long> *)in_stack_fffffffffffff088);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff098,
               SUB81((ulong)in_stack_fffffffffffff090 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff098,
               (pointer)in_stack_fffffffffffff090,(unsigned_long)in_stack_fffffffffffff088);
    boost::unit_test::operator<<
              (in_stack_fffffffffffff090,(basic_cstring<const_char> *)in_stack_fffffffffffff088);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff098,
               (pointer)in_stack_fffffffffffff090,(unsigned_long)in_stack_fffffffffffff088);
    in_stack_fffffffffffff088 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_690,local_6c0,local_6e0,0x6ce,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff088);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff088);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff098,
               (pointer)in_stack_fffffffffffff090,(unsigned_long)in_stack_fffffffffffff088);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff088);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff0c8,in_stack_fffffffffffff0c0,
               in_stack_fffffffffffff0b8,in_stack_fffffffffffff0b0);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffff0a8,in_stack_fffffffffffff0a0);
    str_12._M_str = (char *)in_stack_fffffffffffff108;
    str_12._M_len = in_stack_fffffffffffff100;
    oVar3 = ParseByteUnits(str_12,in_stack_fffffffffffff0d0);
    local_e8._M_value =
         oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long>._M_payload;
    local_e0 = oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
               super__Optional_payload_base<unsigned_long>._M_engaged;
    std::optional::operator_cast_to_bool((optional<unsigned_long> *)in_stack_fffffffffffff088);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff098,
               SUB81((ulong)in_stack_fffffffffffff090 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff098,
               (pointer)in_stack_fffffffffffff090,(unsigned_long)in_stack_fffffffffffff088);
    boost::unit_test::operator<<
              (in_stack_fffffffffffff090,(basic_cstring<const_char> *)in_stack_fffffffffffff088);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff098,
               (pointer)in_stack_fffffffffffff090,(unsigned_long)in_stack_fffffffffffff088);
    in_stack_fffffffffffff088 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_718,local_748,local_768,0x6d1,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff088);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff088);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff098,
               (pointer)in_stack_fffffffffffff090,(unsigned_long)in_stack_fffffffffffff088);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff088);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff0c8,in_stack_fffffffffffff0c0,
               in_stack_fffffffffffff0b8,in_stack_fffffffffffff0b0);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffff0a8,in_stack_fffffffffffff0a0);
    str_13._M_str = (char *)in_stack_fffffffffffff108;
    str_13._M_len = in_stack_fffffffffffff100;
    oVar3 = ParseByteUnits(str_13,in_stack_fffffffffffff0d0);
    local_f8._M_value =
         oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long>._M_payload;
    local_f0 = oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
               super__Optional_payload_base<unsigned_long>._M_engaged;
    std::optional::operator_cast_to_bool((optional<unsigned_long> *)in_stack_fffffffffffff088);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff098,
               SUB81((ulong)in_stack_fffffffffffff090 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff098,
               (pointer)in_stack_fffffffffffff090,(unsigned_long)in_stack_fffffffffffff088);
    boost::unit_test::operator<<
              (in_stack_fffffffffffff090,(basic_cstring<const_char> *)in_stack_fffffffffffff088);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff098,
               (pointer)in_stack_fffffffffffff090,(unsigned_long)in_stack_fffffffffffff088);
    in_stack_fffffffffffff088 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_7a0,local_7d0,local_7f0,0x6d2,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff088);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff088);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff098,
               (pointer)in_stack_fffffffffffff090,(unsigned_long)in_stack_fffffffffffff088);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff088);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff0c8,in_stack_fffffffffffff0c0,
               in_stack_fffffffffffff0b8,in_stack_fffffffffffff0b0);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffff0a8,in_stack_fffffffffffff0a0);
    str_14._M_str = (char *)in_stack_fffffffffffff108;
    str_14._M_len = in_stack_fffffffffffff100;
    oVar3 = ParseByteUnits(str_14,in_stack_fffffffffffff0d0);
    local_108._M_value =
         oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long>._M_payload;
    local_100 = oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                super__Optional_payload_base<unsigned_long>._M_engaged;
    std::optional::operator_cast_to_bool((optional<unsigned_long> *)in_stack_fffffffffffff088);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff098,
               SUB81((ulong)in_stack_fffffffffffff090 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff098,
               (pointer)in_stack_fffffffffffff090,(unsigned_long)in_stack_fffffffffffff088);
    boost::unit_test::operator<<
              (in_stack_fffffffffffff090,(basic_cstring<const_char> *)in_stack_fffffffffffff088);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff098,
               (pointer)in_stack_fffffffffffff090,(unsigned_long)in_stack_fffffffffffff088);
    in_stack_fffffffffffff088 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_828,local_858,local_878,0x6d5,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff088);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff088);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff098,
               (pointer)in_stack_fffffffffffff090,(unsigned_long)in_stack_fffffffffffff088);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff088);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff0c8,in_stack_fffffffffffff0c0,
               in_stack_fffffffffffff0b8,in_stack_fffffffffffff0b0);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffff0a8,in_stack_fffffffffffff0a0);
    str_15._M_str = (char *)in_stack_fffffffffffff108;
    str_15._M_len = in_stack_fffffffffffff100;
    oVar3 = ParseByteUnits(str_15,in_stack_fffffffffffff0d0);
    local_118._M_value =
         oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long>._M_payload;
    local_110 = oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                super__Optional_payload_base<unsigned_long>._M_engaged;
    std::optional::operator_cast_to_bool((optional<unsigned_long> *)in_stack_fffffffffffff088);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff098,
               SUB81((ulong)in_stack_fffffffffffff090 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff098,
               (pointer)in_stack_fffffffffffff090,(unsigned_long)in_stack_fffffffffffff088);
    boost::unit_test::operator<<
              (in_stack_fffffffffffff090,(basic_cstring<const_char> *)in_stack_fffffffffffff088);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff098,
               (pointer)in_stack_fffffffffffff090,(unsigned_long)in_stack_fffffffffffff088);
    in_stack_fffffffffffff088 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_8b0,local_8e0,local_900,0x6d6,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff088);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff088);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff098,
               (pointer)in_stack_fffffffffffff090,(unsigned_long)in_stack_fffffffffffff088);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff088);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff0c8,in_stack_fffffffffffff0c0,
               in_stack_fffffffffffff0b8,in_stack_fffffffffffff0b0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffff090,(char (*) [1])in_stack_fffffffffffff088);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff098,
               (pointer)in_stack_fffffffffffff090,(unsigned_long)in_stack_fffffffffffff088);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffff0a8,in_stack_fffffffffffff0a0);
    str_16._M_str = (char *)in_stack_fffffffffffff108;
    str_16._M_len = in_stack_fffffffffffff100;
    oVar3 = ParseByteUnits(str_16,in_stack_fffffffffffff0d0);
    local_128._M_value =
         oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long>._M_payload;
    local_120 = oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                super__Optional_payload_base<unsigned_long>._M_engaged;
    puVar2 = std::optional<unsigned_long>::value
                       ((optional<unsigned_long> *)in_stack_fffffffffffff098);
    local_968._vptr_lazy_ostream = (_func_int **)0x1400000;
    in_stack_fffffffffffff098 = "20ULL << 20";
    in_stack_fffffffffffff090 = &local_968;
    in_stack_fffffffffffff088 = "ParseByteUnits(\"020M\", noop).value()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long_long>
              (local_940,local_950,0x6d9,1,2,puVar2);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff088);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff098,
               (pointer)in_stack_fffffffffffff090,(unsigned_long)in_stack_fffffffffffff088);
    puVar4 = local_988;
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff088);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff0c8,in_stack_fffffffffffff0c0,
               in_stack_fffffffffffff0b8,in_stack_fffffffffffff0b0);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffff0a8,in_stack_fffffffffffff0a0);
    str_17._M_str = (char *)in_stack_fffffffffffff108;
    str_17._M_len = (size_t)puVar4;
    oVar3 = ParseByteUnits(str_17,in_stack_fffffffffffff0d0);
    local_138._M_value =
         oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long>._M_payload;
    local_130 = oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                super__Optional_payload_base<unsigned_long>._M_engaged;
    std::optional::operator_cast_to_bool((optional<unsigned_long> *)in_stack_fffffffffffff088);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff098,
               SUB81((ulong)in_stack_fffffffffffff090 >> 0x38,0));
    in_stack_fffffffffffff108 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff098,
               (pointer)in_stack_fffffffffffff090,(unsigned_long)in_stack_fffffffffffff088);
    boost::unit_test::operator<<
              (in_stack_fffffffffffff090,(basic_cstring<const_char> *)in_stack_fffffffffffff088);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff098,
               (pointer)in_stack_fffffffffffff090,(unsigned_long)in_stack_fffffffffffff088);
    in_stack_fffffffffffff088 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (&local_9a0,local_9d0,local_9f0,0x6dc,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff088);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff088);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    default_multiplier = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff098,
               (pointer)in_stack_fffffffffffff090,(unsigned_long)in_stack_fffffffffffff088);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff088);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff0c8,in_stack_fffffffffffff0c0,
               in_stack_fffffffffffff0b8,in_stack_fffffffffffff0b0);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffff0a8,in_stack_fffffffffffff0a0);
    str_18._M_str = (char *)in_stack_fffffffffffff108;
    str_18._M_len = (size_t)puVar4;
    oVar3 = ParseByteUnits(str_18,(ByteUnit)default_multiplier);
    local_148._M_value =
         oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long>._M_payload;
    local_140 = oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                super__Optional_payload_base<unsigned_long>._M_engaged;
    std::optional::operator_cast_to_bool((optional<unsigned_long> *)in_stack_fffffffffffff088);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff098,
               SUB81((ulong)in_stack_fffffffffffff090 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff098,
               (pointer)in_stack_fffffffffffff090,(unsigned_long)in_stack_fffffffffffff088);
    boost::unit_test::operator<<
              (in_stack_fffffffffffff090,(basic_cstring<const_char> *)in_stack_fffffffffffff088);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff098,
               (pointer)in_stack_fffffffffffff090,(unsigned_long)in_stack_fffffffffffff088);
    in_stack_fffffffffffff088 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_a28,local_a58,local_a78,0x6df,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff088);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff088);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    line_num = local_a88;
    msg = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff098,
               (pointer)in_stack_fffffffffffff090,(unsigned_long)in_stack_fffffffffffff088);
    file = &local_a98;
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff088);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff0c8,file,(size_t)line_num,msg);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffff0a8,in_stack_fffffffffffff0a0);
    str_19._M_str = (char *)in_stack_fffffffffffff108;
    str_19._M_len = (size_t)puVar4;
    oVar3 = ParseByteUnits(str_19,(ByteUnit)default_multiplier);
    local_158._M_value =
         oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long>._M_payload;
    local_150 = oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                super__Optional_payload_base<unsigned_long>._M_engaged;
    std::optional::operator_cast_to_bool((optional<unsigned_long> *)in_stack_fffffffffffff088);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff098,
               SUB81((ulong)in_stack_fffffffffffff090 >> 0x38,0));
    in_stack_fffffffffffff0c8 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff098,
               (pointer)in_stack_fffffffffffff090,(unsigned_long)in_stack_fffffffffffff088);
    boost::unit_test::operator<<
              (in_stack_fffffffffffff090,(basic_cstring<const_char> *)in_stack_fffffffffffff088);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff098,
               (pointer)in_stack_fffffffffffff090,(unsigned_long)in_stack_fffffffffffff088);
    in_stack_fffffffffffff088 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (&local_ab0,local_ae0,local_b00,0x6e2,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff088);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff088);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(util_ParseByteUnits)
{
    auto noop = ByteUnit::NOOP;

    // no multiplier
    BOOST_CHECK_EQUAL(ParseByteUnits("1", noop).value(), 1);
    BOOST_CHECK_EQUAL(ParseByteUnits("0", noop).value(), 0);

    BOOST_CHECK_EQUAL(ParseByteUnits("1k", noop).value(), 1000ULL);
    BOOST_CHECK_EQUAL(ParseByteUnits("1K", noop).value(), 1ULL << 10);

    BOOST_CHECK_EQUAL(ParseByteUnits("2m", noop).value(), 2'000'000ULL);
    BOOST_CHECK_EQUAL(ParseByteUnits("2M", noop).value(), 2ULL << 20);

    BOOST_CHECK_EQUAL(ParseByteUnits("3g", noop).value(), 3'000'000'000ULL);
    BOOST_CHECK_EQUAL(ParseByteUnits("3G", noop).value(), 3ULL << 30);

    BOOST_CHECK_EQUAL(ParseByteUnits("4t", noop).value(), 4'000'000'000'000ULL);
    BOOST_CHECK_EQUAL(ParseByteUnits("4T", noop).value(), 4ULL << 40);

    // check default multiplier
    BOOST_CHECK_EQUAL(ParseByteUnits("5", ByteUnit::K).value(), 5ULL << 10);

    // NaN
    BOOST_CHECK(!ParseByteUnits("", noop));
    BOOST_CHECK(!ParseByteUnits("foo", noop));

    // whitespace
    BOOST_CHECK(!ParseByteUnits("123m ", noop));
    BOOST_CHECK(!ParseByteUnits(" 123m", noop));

    // no +-
    BOOST_CHECK(!ParseByteUnits("-123m", noop));
    BOOST_CHECK(!ParseByteUnits("+123m", noop));

    // zero padding
    BOOST_CHECK_EQUAL(ParseByteUnits("020M", noop).value(), 20ULL << 20);

    // fractions not allowed
    BOOST_CHECK(!ParseByteUnits("0.5T", noop));

    // overflow
    BOOST_CHECK(!ParseByteUnits("18446744073709551615g", noop));

    // invalid unit
    BOOST_CHECK(!ParseByteUnits("1x", noop));
}